

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDrawCreateInfoUtil.cpp
# Opt level: O3

void __thiscall
vkt::Draw::SubpassDescription::SubpassDescription(SubpassDescription *this,SubpassDescription *rhs)

{
  (this->m_preserveAttachments).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_preserveAttachments).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_resolveAttachments).
  super__Vector_base<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_preserveAttachments).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_resolveAttachments).
  super__Vector_base<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_resolveAttachments).
  super__Vector_base<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_colorAttachments).
  super__Vector_base<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_colorAttachments).
  super__Vector_base<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_inputAttachments).
  super__Vector_base<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_colorAttachments).
  super__Vector_base<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_inputAttachments).
  super__Vector_base<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_inputAttachments).
  super__Vector_base<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  operator=(this,rhs);
  return;
}

Assistant:

SubpassDescription::SubpassDescription (const SubpassDescription& rhs) {
	*this = rhs;
}